

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:940:38),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:945:6)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:940:38),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:945:6)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>_>
  depResult;
  ExceptionOr<kj::_::Void> local_388;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>_>
  local_1e8;
  
  local_1e8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1e8.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_1e8.super_ExceptionOrValue);
  if (local_1e8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    local_388.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_388.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_388);
  }
  else {
    if (local_1e8.value.ptr.isSet != true) goto LAB_00177459;
    anon_class_1_0_00000001_for_func::operator()
              ((anon_class_1_0_00000001_for_func *)this,&local_1e8.value.ptr.field_1.value);
    local_388.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_388.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_388);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_388);
LAB_00177459:
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>_>
  ::~ExceptionOr(&local_1e8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }